

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_PhaseCalcIncrement(ym3438_t *chip)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ushort uVar4;
  byte bVar5;
  byte local_34;
  byte local_2e;
  Bit8u kcode;
  Bit8u sum_l;
  Bit8u sum_h;
  Bit8u sum;
  Bit8u note;
  Bit8u block;
  Bit8u detune;
  Bit8u dt_l;
  Bit8u dt;
  Bit8u pms;
  Bit8u lfo_l;
  Bit8u lfo;
  Bit32u basefreq;
  Bit32u fm;
  Bit32u fnum_h;
  Bit32u fnum;
  Bit32u slot;
  Bit32u chan;
  ym3438_t *chip_local;
  
  uVar3 = chip->cycles;
  uVar4 = chip->pg_fnum >> 4;
  bVar5 = chip->lfo_pm;
  sum_h = bVar5 & 0xf;
  bVar1 = chip->pms[chip->channel];
  bVar2 = chip->dt[uVar3];
  local_2e = 0;
  local_34 = chip->pg_kcode;
  if ((bVar5 & 8) != 0) {
    sum_h = sum_h ^ 0xf;
  }
  _dt = (uint)(uVar4 >> ((byte)pg_lfo_sh1[bVar1][sum_h] & 0x1f)) +
        (uint)(uVar4 >> ((byte)pg_lfo_sh2[bVar1][sum_h] & 0x1f));
  if (5 < bVar1) {
    _dt = _dt << (bVar1 - 5 & 0x1f);
  }
  _dt = _dt >> 2;
  if ((bVar5 & 0x10) != 0) {
    _dt = -_dt;
  }
  fm = (uint)chip->pg_fnum * 2 + _dt;
  if ((bVar2 & 3) != 0) {
    if (0x1c < local_34) {
      local_34 = 0x1c;
    }
    bVar5 = (char)((int)(uint)local_34 >> 2) + '\t' + ((bVar2 & 3) == 3 | bVar2 & 2);
    local_2e = (byte)(pg_detune[(int)((uint)(bVar5 & 1) << 2 | (uint)(local_34 & 3))] >>
                     (9U - (char)((int)(uint)bVar5 >> 1) & 0x1f));
  }
  if ((bVar2 & 4) == 0) {
    _note = (uint)local_2e;
  }
  else {
    _note = -(uint)local_2e;
  }
  _note = (((fm & 0xfff) << (chip->pg_block & 0x1f)) >> 2) + _note;
  chip->pg_inc[uVar3] = (_note & 0x1ffff) * (uint)chip->multi[uVar3] >> 1;
  chip->pg_inc[uVar3] = chip->pg_inc[uVar3] & 0xfffff;
  return;
}

Assistant:

void OPN2_PhaseCalcIncrement(ym3438_t *chip)
{
    Bit32u chan = chip->channel;
    Bit32u slot = chip->cycles;
    Bit32u fnum = chip->pg_fnum;
    Bit32u fnum_h = fnum >> 4;
    Bit32u fm;
    Bit32u basefreq;
    Bit8u lfo = chip->lfo_pm;
    Bit8u lfo_l = lfo & 0x0f;
    Bit8u pms = chip->pms[chan];
    Bit8u dt = chip->dt[slot];
    Bit8u dt_l = dt & 0x03;
    Bit8u detune = 0;
    Bit8u block, note;
    Bit8u sum, sum_h, sum_l;
    Bit8u kcode = chip->pg_kcode;

    fnum <<= 1;
    /* Apply LFO */
    if (lfo_l & 0x08)
    {
        lfo_l ^= 0x0f;
    }
    fm = (fnum_h >> pg_lfo_sh1[pms][lfo_l]) + (fnum_h >> pg_lfo_sh2[pms][lfo_l]);
    if (pms > 5)
    {
        fm <<= pms - 5;
    }
    fm >>= 2;
    if (lfo & 0x10)
    {
        fnum -= fm;
    }
    else
    {
        fnum += fm;
    }
    fnum &= 0xfff;

    basefreq = (fnum << chip->pg_block) >> 2;

    /* Apply detune */
    if (dt_l)
    {
        if (kcode > 0x1c)
        {
            kcode = 0x1c;
        }
        block = kcode >> 2;
        note = kcode & 0x03;
        sum = block + 9 + ((dt_l == 3) | (dt_l & 0x02));
        sum_h = sum >> 1;
        sum_l = sum & 0x01;
        detune = pg_detune[(sum_l << 2) | note] >> (9 - sum_h);
    }
    if (dt & 0x04)
    {
        basefreq -= detune;
    }
    else
    {
        basefreq += detune;
    }
    basefreq &= 0x1ffff;
    chip->pg_inc[slot] = (basefreq * chip->multi[slot]) >> 1;
    chip->pg_inc[slot] &= 0xfffff;
}